

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

void borg_follow_kill(wchar_t i)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  wchar_t x;
  wchar_t y;
  wchar_t wVar4;
  wchar_t wVar5;
  borg_grid *pbVar6;
  chunk_conflict *c;
  _Bool _Var7;
  uint32_t uVar8;
  char *pcVar9;
  loc grid;
  borg_kill *pbVar10;
  wchar_t wVar11;
  int iVar12;
  wchar_t wVar13;
  long lVar14;
  int local_40;
  int local_3c;
  
  if (borg_kills[i].r_idx != 0) {
    pbVar10 = borg_kills + i;
    x = (pbVar10->pos).x;
    y = (pbVar10->pos).y;
    _Var7 = borg_follow_kill_aux(i,y,x);
    if (_Var7) {
      uVar1 = pbVar10->r_idx;
      if (uVar1 == 0) {
        pcVar9 = "dead monster";
      }
      else if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
        pcVar9 = r_info[(uint)uVar1].name;
      }
      else {
        pcVar9 = "player ghost";
      }
      pcVar9 = format("# There was a monster \'%s\' at (%d,%d)",pcVar9,(ulong)(uint)y,(ulong)(uint)x
                     );
      borg_note(pcVar9);
      _Var7 = borg_cave_floor_bold(y,x);
      if (((_Var7) && (uVar8 = Rand_div(100), -1 < (int)uVar8)) && (borg_t < 0x4e21)) {
        _Var7 = flag_has_dbg(r_info[pbVar10->r_idx].flags,0xb,0x15,"r_info[kill->r_idx].flags",
                             "RF_NEVER_MOVE");
        if ((_Var7) || (pbVar10->awake == false)) {
          if ((pbVar10->pos).y != borg.c.y) {
            return;
          }
          if ((pbVar10->pos).x != borg.c.x) {
            return;
          }
        }
        else {
          lVar14 = 0;
          local_40 = 0;
          local_3c = 0;
          do {
            c = cave;
            sVar2 = ddx_ddd[lVar14];
            sVar3 = ddy_ddd[lVar14];
            wVar11 = x + sVar2;
            wVar13 = y + sVar3;
            grid = (loc)loc(wVar11,wVar13);
            _Var7 = square_in_bounds_fully(c,grid);
            if (_Var7) {
              pbVar6 = borg_grids[wVar13];
              _Var7 = borg_cave_floor_grid(pbVar6 + wVar11);
              if (((_Var7) && (pbVar6[wVar11].kill == '\0')) &&
                 (_Var7 = borg_follow_kill_aux(i,wVar13,wVar11), !_Var7)) {
                local_3c = local_3c + sVar2;
                local_40 = local_40 + sVar3;
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          if (0 < local_3c) {
            local_3c = 1;
          }
          if (local_3c < 0) {
            local_3c = -1;
          }
          iVar12 = 1;
          if (local_40 < 1) {
            iVar12 = local_40;
          }
          if (iVar12 < 0) {
            iVar12 = -1;
          }
          wVar11 = local_3c + x;
          wVar13 = iVar12 + y;
          pbVar6 = borg_grids[wVar13];
          _Var7 = borg_cave_floor_grid(pbVar6 + wVar11);
          if ((_Var7) && ((uint)pbVar6[wVar11].kill == i)) {
            wVar4 = (pbVar10->pos).y;
            wVar5 = (pbVar10->pos).x;
            if (wVar5 != x || wVar4 != y) {
              borg_grids[wVar4][wVar5].kill = '\0';
              pbVar10->ox = (uint8_t)x;
              pbVar10->oy = (uint8_t)y;
              (pbVar10->pos).x = wVar11;
              (pbVar10->pos).y = wVar13;
              borg_grids[wVar13][wVar11].kill = (uint8_t)i;
              uVar1 = pbVar10->r_idx;
              if (uVar1 == 0) {
                pcVar9 = "dead monster";
              }
              else if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
                pcVar9 = r_info[(uint)uVar1].name;
              }
              else {
                pcVar9 = "player ghost";
              }
              pcVar9 = format("# Following a monster \'%s\' to (%d,%d) from (%d,%d)",pcVar9,
                              (ulong)(uint)wVar13,(ulong)(uint)wVar11,(ulong)(uint)y);
              borg_note(pcVar9);
              if (borg.goal.type == 1 && borg.trait[0x25] == 0) {
                if ((pbVar10->pos).y != (uint)borg_flow_y[0]) {
                  borg_danger_wipe = true;
                  return;
                }
                if ((pbVar10->pos).x != (uint)borg_flow_x[0]) {
                  borg_danger_wipe = true;
                  return;
                }
              }
              else {
                if (borg.goal.type != 2) {
                  borg_danger_wipe = true;
                  return;
                }
                if (borg.munchkin_mode != true) {
                  borg_danger_wipe = true;
                  return;
                }
              }
              borg_danger_wipe = true;
              borg.goal.type = 0;
              return;
            }
          }
        }
      }
      borg_delete_kill(i);
      return;
    }
  }
  return;
}

Assistant:

void borg_follow_kill(int i)
{
    int j;
    int x, y;
    int ox, oy;

    int dx, b_dx = 0;
    int dy, b_dy = 0;

    borg_grid *ag;

    borg_kill *kill = &borg_kills[i];

    /* Paranoia */
    if (!kill->r_idx)
        return;

    /* Old location */
    ox = kill->pos.x;
    oy = kill->pos.y;

    /* Out of sight */
    if (!borg_follow_kill_aux(i, oy, ox))
        return;

    /* Note */
    borg_note(format("# There was a monster '%s' at (%d,%d)",
        borg_race_name(kill->r_idx), oy, ox));

    /* Prevent silliness */
    if (!borg_cave_floor_bold(oy, ox)) {
        /* Delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Prevent loops */
    if (randint1(100) < 1) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* prevent overflows */
    if (borg_t > 20000) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Some never move, no reason to follow them */
    if ((rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE)) ||
        /* Some are sleeping and don't move, no reason to follow them */
        (kill->awake == false)) {
        /* delete them if they are under me */
        if (kill->pos.y == borg.c.y && kill->pos.x == borg.c.x) {
            borg_delete_kill(i);
        }
        /* Don't 'forget' certain ones */
        return;
    }

    /* Scan locations */
    for (j = 0; j < 8; j++) {
        /* Access offset */
        dx = ddx_ddd[j];
        dy = ddy_ddd[j];

        /* Access location */
        x = ox + dx;
        y = oy + dy;

        /* legal */
        if (!square_in_bounds_fully(cave, loc(x, y)))
            continue;

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Skip known walls and doors */
        if (!borg_cave_floor_grid(ag))
            continue;

        /* Skip known monsters */
        if (ag->kill)
            continue;

        /* Skip visible grids */
        if (borg_follow_kill_aux(i, y, x))
            continue;

        /* Collect the offsets */
        b_dx += dx;
        b_dy += dy;
    }

    /* Don't go too far */
    if (b_dx < -1)
        b_dx = -1;
    else if (b_dx > 1)
        b_dx = 1;

    /* Don't go too far */
    if (b_dy < -1)
        b_dy = -1;
    else if (b_dy > 1)
        b_dy = 1;

    /* Access location */
    x = ox + b_dx;
    y = oy + b_dy;

    /* Access the grid */
    ag = &borg_grids[y][x];

    /* Avoid walls and doors */
    if (!borg_cave_floor_grid(ag)) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Avoid monsters */
    if (ag->kill != i) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Delete monsters that did not really move */
    if (kill->pos.y == oy && kill->pos.x == ox) {
        borg_delete_kill(i);
        return;
    }

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = 0;

    /* Save the old Location */
    kill->ox = ox;
    kill->oy = oy;

    /* Save the Location */
    kill->pos.x = ox + b_dx;
    kill->pos.y = oy + b_dy;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = i;

    /* Note */
    borg_note(format("# Following a monster '%s' to (%d,%d) from (%d,%d)",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, oy, ox));

    /* Recalculate danger */
    borg_danger_wipe = true;

    /* Clear goals */
    if ((!borg.trait[BI_ESP] && borg.goal.type == GOAL_KILL
            && (borg_flow_y[0] == kill->pos.y && borg_flow_x[0] == kill->pos.x))
        || (borg.goal.type == GOAL_TAKE && borg.munchkin_mode))
        borg.goal.type = 0;
}